

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test6.cpp
# Opt level: O2

int main(void)

{
  Writer *pWVar1;
  EventLoop *this;
  pid_t local_1dc;
  undefined1 local_1d8 [24];
  code *local_1c0;
  LineNumber local_1b8;
  char *local_1b0;
  VerboseLevel local_1a8;
  Logger *local_1a0;
  bool local_198;
  Logger *local_190;
  char *local_188;
  DispatchAction local_180;
  pointer local_178;
  pointer pbStack_170;
  pointer local_168;
  EventLoopThread loopThread;
  
  loopThread._loop = (EventLoop *)&PTR__Writer_0012be20;
  loopThread._exiting = false;
  loopThread._9_7_ = 0;
  loopThread._thread._started = true;
  loopThread._thread._joined = false;
  loopThread._thread._2_2_ = 0;
  loopThread._thread._pthreadId = (pthread_t)anon_var_dwarf_20f6;
  loopThread._thread._tid = 0x13;
  loopThread._thread._20_4_ = 0;
  loopThread._thread._func.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_2b25
  ;
  loopThread._thread._func.super__Function_base._M_functor._8_2_ = 0;
  loopThread._thread._func.super__Function_base._M_manager = (_Manager_type)0x0;
  loopThread._thread._func._M_invoker._0_1_ = 0;
  loopThread._thread._name._M_dataplus._M_p = (pointer)0x0;
  loopThread._thread._name._M_string_length = (long)"reason: %s\n" + 0xb;
  loopThread._thread._name.field_2._M_allocated_capacity._0_4_ = 2;
  loopThread._thread._name.field_2._8_8_ = 0;
  loopThread._thread._latch._mutex._mutex.__align = 0;
  loopThread._thread._latch._mutex._mutex._8_8_ = 0;
  pWVar1 = el::base::Writer::construct((Writer *)&loopThread,1,"default");
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [13])"main: pid = ");
  local_1d8._0_4_ = getpid();
  pWVar1 = el::base::Writer::operator<<(pWVar1,(int *)local_1d8);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [9])", tid = ");
  local_1dc = mario::CurrentThread::tid();
  el::base::Writer::operator<<(pWVar1,&local_1dc);
  el::base::Writer::~Writer((Writer *)&loopThread);
  mario::EventLoopThread::EventLoopThread(&loopThread);
  this = mario::EventLoopThread::startLoop(&loopThread);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = runInThread;
  local_1c0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1d8._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  mario::EventLoop::runInLoop(this,(Functor *)local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)local_1d8);
  sleep(1);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = runInThread;
  local_1c0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1d8._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  mario::EventLoop::runEvery(this,1.0,(TimerCallback *)local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)local_1d8);
  sleep(5);
  mario::EventLoop::quit(this);
  local_1d8._0_8_ = &PTR__Writer_0012be20;
  local_1d8._8_8_ = 0;
  local_1d8._16_4_ = 0x80;
  local_1c0 = (code *)0x11b010;
  local_1b8 = 0x1e;
  local_1b0 = "int main()";
  local_1a8 = 0;
  local_1a0 = (Logger *)0x0;
  local_198 = false;
  local_190 = (Logger *)0x0;
  local_188 = "";
  local_180 = NormalLog;
  local_178 = (pointer)0x0;
  pbStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  pWVar1 = el::base::Writer::construct((Writer *)local_1d8,1,"default");
  el::base::Writer::operator<<(pWVar1,(char (*) [10])"exit main");
  el::base::Writer::~Writer((Writer *)local_1d8);
  mario::EventLoopThread::~EventLoopThread(&loopThread);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::EventLoopThread loopThread;
    mario::EventLoop* loop = loopThread.startLoop();

    loop->runInLoop(runInThread);
    sleep(1);
    loop->runEvery(1, runInThread);
    sleep(5);
    loop->quit();

    LOG(INFO) << "exit main";
}